

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

AlexNode<int,_int> * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::NodeIterator::
next(NodeIterator *this)

{
  value_type pAVar1;
  bool bVar2;
  int iVar3;
  reference ppAVar4;
  value_type *in_RDI;
  int i;
  model_node_type *node;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  AlexNode<int,_int> *local_8;
  
  bVar2 = std::
          stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
          ::empty((stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
                   *)0x1735ab);
  if (bVar2) {
    in_RDI[1] = (value_type)0x0;
    local_8 = (AlexNode<int,_int> *)0x0;
  }
  else {
    ppAVar4 = std::
              stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
              ::top((stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
                     *)0x1735d8);
    in_RDI[1] = *ppAVar4;
    std::
    stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
    ::pop((stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
           *)0x1735ec);
    if ((in_RDI[1]->is_leaf_ & 1U) == 0) {
      pAVar1 = in_RDI[1];
      std::
      stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
      ::push((stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
              *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
      for (iVar3 = *(int *)&pAVar1[1].is_leaf_ + -2; -1 < iVar3; iVar3 = iVar3 + -1) {
        if (*(long *)((long)pAVar1[1].model_.a_ + (long)iVar3 * 8) !=
            *(long *)((long)pAVar1[1].model_.a_ + (long)(iVar3 + 1) * 8)) {
          std::
          stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
          ::push((stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
                  *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),in_RDI);
        }
      }
    }
    local_8 = in_RDI[1];
  }
  return local_8;
}

Assistant:

AlexNode<T, P>* next() {
      if (node_stack_.empty()) {
        cur_node_ = nullptr;
        return nullptr;
      }

      cur_node_ = node_stack_.top();
      node_stack_.pop();

      if (!cur_node_->is_leaf_) {
        auto node = static_cast<model_node_type*>(cur_node_);
        node_stack_.push(node->children_[node->num_children_ - 1]);
        for (int i = node->num_children_ - 2; i >= 0; i--) {
          if (node->children_[i] != node->children_[i + 1]) {
            node_stack_.push(node->children_[i]);
          }
        }
      }

      return cur_node_;
    }